

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O3

void nhr_response_read_chunks(nhr_response r,char *str)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *data;
  uint local_2c;
  
  while( true ) {
    local_2c = 0;
    iVar1 = __isoc99_sscanf(str,"%X",&local_2c);
    if ((iVar1 != 1) && (iVar1 = __isoc99_sscanf(str,"%x",&local_2c), iVar1 != 1)) {
      return;
    }
    ppuVar2 = __ctype_b_loc();
    data = str + 1;
    do {
      pcVar3 = data;
      data = pcVar3 + 1;
    } while ((*(byte *)((long)*ppuVar2 + (long)pcVar3[-1] * 2 + 1) & 0x10) != 0);
    if ((ulong)local_2c == 0) break;
    nhr_response_add_body_data(r,data,(ulong)local_2c);
    str = data + (ulong)local_2c + 2;
  }
  iVar1 = strncmp(pcVar3 + -1,k_nhr_double_CRLF,4);
  if (iVar1 == 0) {
    r->is_all_chunks_processed = '\x01';
  }
  return;
}

Assistant:

void nhr_response_read_chunks(nhr_response r, char * str) {
	unsigned int chunk_len = 0;
	while ((nhr_sscanf(str, "%X", &chunk_len) == 1) || (nhr_sscanf(str, "%x", &chunk_len) == 1)) {
		while (isxdigit(*str)) str++;
		if (chunk_len == 0) {
			if (strncmp(str, k_nhr_double_CRLF, k_nhr_double_CRLF_length) == 0) {
				r->is_all_chunks_processed = nhr_true;
			}
			break;
		}
		str += k_nhr_CRLF_length;
		nhr_response_add_body_data(r, str, chunk_len);
		str += chunk_len;
		str += k_nhr_CRLF_length;
		chunk_len = 0;
	}
}